

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseValueTypeList
          (WastParser *this,TypeVector *out_type_list,ReferenceVars *type_vars)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  TokenType TVar4;
  Result RVar5;
  char *pcVar6;
  int __c;
  int __c_00;
  Var *__s;
  ReferenceVar local_110;
  Var type;
  Var local_78;
  
  do {
    bVar3 = PeekMatchRefType(this);
    if ((!bVar3) && (TVar4 = Peek(this,0), TVar4 != First_Type)) {
      return (Result)Ok;
    }
    Var::Var(&type);
    __s = &type;
    RVar5 = ParseValueType(this,&type);
    if (RVar5.enum_ == Error) {
      Var::~Var(&type);
      return (Result)Error;
    }
    if (type.type_ == Name) {
      if ((this->options_->features).function_references_enabled_ == false) {
        __assert_fail("options_->features.function_references_enabled()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0x3b4,
                      "Result wabt::WastParser::ParseValueTypeList(TypeVector *, ReferenceVars *)");
      }
      pTVar1 = (out_type_list->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pTVar2 = (out_type_list->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Var::Var(&local_78,&type);
      local_110.index = (uint32_t)((ulong)((long)pTVar1 - (long)pTVar2) >> 3);
      Var::Var(&local_110.var,&local_78);
      std::vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
      emplace_back<wabt::WastParser::ReferenceVar>(type_vars,&local_110);
      Var::~Var(&local_110.var);
      Var::~Var(&local_78);
      local_110.index = 0xffffffeb;
      local_110._4_4_ = 0xffffffff;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
                (out_type_list,(Type *)&local_110);
    }
    else {
      if (type.type_ != Index) {
        __assert_fail("type.is_name()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0x3b3,
                      "Result wabt::WastParser::ParseValueTypeList(TypeVector *, ReferenceVars *)");
      }
      pcVar6 = Var::index(&type,(char *)__s,__c);
      if ((uint)pcVar6 < 0xffffffc0) {
        pcVar6 = Var::index(&type,(char *)__s,__c_00);
        local_110._4_4_ = (int)pcVar6;
        local_110.index = 0xffffffeb;
      }
      else {
        pcVar6 = Var::index(&type,(char *)__s,__c_00);
        Type::Type((Type *)&local_110,(int32_t)pcVar6);
      }
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
                (out_type_list,(Type *)&local_110);
    }
    Var::~Var(&type);
  } while (RVar5.enum_ != Error);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseValueTypeList(TypeVector* out_type_list,
                                      ReferenceVars* type_vars) {
  WABT_TRACE(ParseValueTypeList);
  while (true) {
    if (!PeekMatchRefType() && !PeekMatch(TokenType::ValueType)) {
      break;
    }

    Var type;
    CHECK_RESULT(ParseValueType(&type));

    if (type.is_index()) {
      // TODO: Incorrect values can be misinterpreted by the parser.
      if (type.index() >= static_cast<Index>(Type::Void)) {
        out_type_list->push_back(Type(type.index()));
      } else {
        out_type_list->push_back(Type(Type::Reference, type.index()));
      }
    } else {
      assert(type.is_name());
      assert(options_->features.function_references_enabled());
      type_vars->push_back(ReferenceVar(out_type_list->size(), type));
      out_type_list->push_back(Type(Type::Reference, kInvalidIndex));
    }
  }

  return Result::Ok;
}